

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFReader.cpp
# Opt level: O0

Barcodes *
ZXing::Pdf417::DoDecode(BinaryBitmap *image,bool multiple,bool tryRotate,bool returnErrors)

{
  bool bVar1;
  element_type *p;
  PointI tl;
  PointI tr;
  PointI br;
  byte in_CL;
  byte in_DL;
  Barcodes *in_RDI;
  byte in_R8B;
  anon_class_16_2_7b74b981 point;
  DecoderResult decoderResult;
  array<ZXing::Nullable<ZXing::ResultPoint>,_8UL> *points;
  iterator __end2;
  iterator __begin2;
  list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
  *__range2;
  anon_class_48_1_ba1d7400 rotate;
  Result detectorResult;
  Barcodes *res;
  Nullable<ZXing::ResultPoint> *in_stack_00000478;
  Nullable<ZXing::ResultPoint> *in_stack_00000480;
  Nullable<ZXing::ResultPoint> *in_stack_00000488;
  Nullable<ZXing::ResultPoint> *in_stack_00000490;
  BitMatrix *in_stack_00000498;
  int in_stack_000004b0;
  int in_stack_000004b8;
  int in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  int in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd54;
  PointI in_stack_fffffffffffffd58;
  PointI in_stack_fffffffffffffd60;
  Result *in_stack_fffffffffffffd68;
  PointI __args;
  Result *in_stack_fffffffffffffd70;
  PointI this;
  Quadrilateral<ZXing::PointT<int>_> local_218;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  bool in_stack_fffffffffffffe66;
  bool in_stack_fffffffffffffe67;
  BinaryBitmap *in_stack_fffffffffffffe68;
  _Self local_a8;
  _Self local_a0;
  list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
  *local_98;
  byte local_8d;
  int local_4c;
  list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
  lStack_38;
  byte local_13;
  byte local_12;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  local_13 = in_R8B & 1;
  Detector::Detect(in_stack_fffffffffffffe68,in_stack_fffffffffffffe67,in_stack_fffffffffffffe66);
  bVar1 = std::__cxx11::
          list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
          ::empty(&lStack_38);
  if (bVar1) {
    memset(in_RDI,0,0x18);
    std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::vector
              ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)0x2cc834);
    local_4c = 1;
  }
  else {
    Detector::Result::Result(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    local_8d = 0;
    std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::vector
              ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)0x2cc86d);
    local_98 = &lStack_38;
    local_a0._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
         ::begin((list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                  *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    local_a8._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
         ::end((list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    while (bVar1 = std::operator!=(&local_a0,&local_a8), bVar1) {
      std::_List_iterator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>::operator*
                ((_List_iterator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_> *)
                 CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      p = std::__shared_ptr_access<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator*((__shared_ptr_access<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>::operator[]
                ((array<ZXing::Nullable<ZXing::ResultPoint>,_8UL> *)
                 CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>::operator[]
                ((array<ZXing::Nullable<ZXing::ResultPoint>,_8UL> *)
                 CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>::operator[]
                ((array<ZXing::Nullable<ZXing::ResultPoint>,_8UL> *)
                 CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>::operator[]
                ((array<ZXing::Nullable<ZXing::ResultPoint>,_8UL> *)
                 CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      in_stack_fffffffffffffd48 =
           GetMinCodewordWidth((array<ZXing::Nullable<ZXing::ResultPoint>,_8UL> *)p);
      in_stack_fffffffffffffd50 =
           GetMaxCodewordWidth((array<ZXing::Nullable<ZXing::ResultPoint>,_8UL> *)p);
      ScanningDecoder::Decode
                (in_stack_00000498,in_stack_00000490,in_stack_00000488,in_stack_00000480,
                 in_stack_00000478,in_stack_000004b0,in_stack_000004b8);
      bVar1 = DecoderResult::isValid
                        ((DecoderResult *)in_stack_fffffffffffffd60,
                         in_stack_fffffffffffffd58.y._3_1_);
      if (bVar1) {
        local_1e8 = 0;
        uStack_1e0 = 0;
        local_1f8 = 0;
        uStack_1f0 = 0;
        BitMatrix::BitMatrix((BitMatrix *)0x2cca17);
        tl = DoDecode::anon_class_16_2_7b74b981::operator()
                       ((anon_class_16_2_7b74b981 *)in_stack_fffffffffffffd58,
                        in_stack_fffffffffffffd54);
        this = tl;
        tr = DoDecode::anon_class_16_2_7b74b981::operator()
                       ((anon_class_16_2_7b74b981 *)in_stack_fffffffffffffd58,
                        in_stack_fffffffffffffd54);
        __args = tr;
        br = DoDecode::anon_class_16_2_7b74b981::operator()
                       ((anon_class_16_2_7b74b981 *)in_stack_fffffffffffffd58,
                        in_stack_fffffffffffffd54);
        in_stack_fffffffffffffd60 = br;
        in_stack_fffffffffffffd58 =
             DoDecode::anon_class_16_2_7b74b981::operator()
                       ((anon_class_16_2_7b74b981 *)in_stack_fffffffffffffd58,
                        in_stack_fffffffffffffd54);
        Quadrilateral<ZXing::PointT<int>_>::Quadrilateral
                  (&local_218,tl,tr,br,in_stack_fffffffffffffd58);
        DetectorResult::DetectorResult
                  ((DetectorResult *)in_stack_fffffffffffffd60,
                   (BitMatrix *)in_stack_fffffffffffffd58,
                   (QuadrilateralI *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
        std::vector<ZXing::Result,std::allocator<ZXing::Result>>::
        emplace_back<ZXing::DecoderResult,ZXing::DetectorResult,ZXing::BarcodeFormat>
                  ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)this,
                   (DecoderResult *)__args,(DetectorResult *)in_stack_fffffffffffffd60,
                   (BarcodeFormat *)in_stack_fffffffffffffd58);
        DetectorResult::~DetectorResult((DetectorResult *)0x2ccb30);
        BitMatrix::~BitMatrix((BitMatrix *)0x2ccb3d);
        if ((local_11 & 1) != 0) goto LAB_002ccbf6;
        local_8d = 1;
        local_4c = 1;
      }
      else {
LAB_002ccbf6:
        local_4c = 0;
      }
      DecoderResult::~DecoderResult
                ((DecoderResult *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      if (local_4c != 0) goto LAB_002ccc51;
      std::_List_iterator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>::operator++
                (&local_a0);
    }
    local_8d = 1;
    local_4c = 1;
LAB_002ccc51:
    if ((local_8d & 1) == 0) {
      std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector
                ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)in_stack_fffffffffffffd60)
      ;
    }
    DoDecode(ZXing::BinaryBitmap_const&,bool,bool,bool)::$_1::~__1
              ((anon_class_48_1_ba1d7400 *)0x2ccc72);
  }
  Detector::Result::~Result((Result *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50))
  ;
  return in_RDI;
}

Assistant:

static Barcodes DoDecode(const BinaryBitmap& image, bool multiple, bool tryRotate, bool returnErrors)
{
	Detector::Result detectorResult = Detector::Detect(image, multiple, tryRotate);
	if (detectorResult.points.empty())
		return {};

	auto rotate = [res = detectorResult](PointI p) {
		switch(res.rotation) {
		case 90: return PointI(res.bits->height() - p.y - 1, p.x);
		case 180: return PointI(res.bits->width() - p.x - 1, res.bits->height() - p.y - 1);
		case 270: return PointI(p.y, res.bits->width() - p.x - 1);
		}
		return p;
	};

	Barcodes res;
	for (const auto& points : detectorResult.points) {
		DecoderResult decoderResult =
			ScanningDecoder::Decode(*detectorResult.bits, points[4], points[5], points[6], points[7],
									GetMinCodewordWidth(points), GetMaxCodewordWidth(points));
		if (decoderResult.isValid(returnErrors)) {
			auto point = [&](int i) { return rotate(PointI(points[i].value())); };
			res.emplace_back(std::move(decoderResult), DetectorResult{{}, {point(0), point(2), point(3), point(1)}},
							 BarcodeFormat::PDF417);
			if (!multiple)
				return res;
		}
	}
	return res;
}